

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<unsigned_long,1,3,1,1,3>>::
resizeLike<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,Eigen::Matrix<unsigned_long,1,3,1,1,3>>>
          (PlainObjectBase<Eigen::Matrix<unsigned_long,1,3,1,1,3>> *this,
          EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>_>
          *_other)

{
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>
  *other;
  
  PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>::resize
            ((PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_> *)this,1,3);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC 
    EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(other.rows(), other.cols());
      const Index othersize = other.rows()*other.cols();
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }